

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManCutMap(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Ptr_t *vSupps)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  char *__format;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong local_50;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  if (vResult->nSize < 1) {
    uVar23 = 0;
    local_50._0_4_ = 100;
  }
  else {
    local_50 = 100;
    uVar17 = 0;
    do {
      pvVar9 = vResult->pArray[uVar17];
      iVar18 = p->vObjs->nSize;
      piVar7 = (int *)malloc(0x10);
      iVar19 = iVar18;
      if (iVar18 - 1U < 0xf) {
        iVar19 = 0x10;
      }
      *piVar7 = iVar19;
      if (iVar19 == 0) {
        piVar7[2] = 0;
        piVar7[3] = 0;
        piVar7[1] = iVar18;
LAB_0083d6d4:
        pvVar8 = (void *)0x0;
      }
      else {
        pvVar8 = malloc((long)iVar19 << 2);
        *(void **)(piVar7 + 2) = pvVar8;
        piVar7[1] = iVar18;
        if (pvVar8 == (void *)0x0) goto LAB_0083d6d4;
        memset(pvVar8,0,(long)iVar18 << 2);
      }
      iVar18 = *(int *)((long)pvVar9 + 4);
      if (0 < iVar18) {
        lVar14 = *(long *)((long)pvVar9 + 8);
        lVar12 = 0;
        do {
          piVar3 = *(int **)(lVar14 + lVar12 * 8);
          if (((piVar3[6] & 7U) != 2) || (p->nTruePis <= *piVar3)) {
            iVar18 = piVar3[9];
            if (((long)iVar18 < 0) || (piVar7[1] <= iVar18)) goto LAB_0083dddb;
            *(undefined4 *)((long)pvVar8 + (long)iVar18 * 4) = 1;
            iVar18 = *(int *)((long)pvVar9 + 4);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar18);
      }
      iVar18 = (int)local_50;
      if ((int)uVar17 == iVar18) {
        if (iVar18 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          local_50 = 0x10;
        }
        else {
          local_50 = (ulong)(uint)(iVar18 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(local_50 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,local_50 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar18 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      uVar23 = uVar17 + 1;
      pVVar5->nSize = (int)uVar23;
      ppvVar6[uVar17 & 0xffffffff] = piVar7;
      uVar17 = uVar23;
    } while ((long)uVar23 < (long)vResult->nSize);
  }
  iVar18 = p->vObjs->nSize;
  piVar7 = (int *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar19 = iVar18;
  }
  *piVar7 = iVar19;
  if (iVar19 == 0) {
    piVar7[2] = 0;
    piVar7[3] = 0;
    piVar7[1] = iVar18;
  }
  else {
    pvVar9 = malloc((long)iVar19 << 2);
    *(void **)(piVar7 + 2) = pvVar9;
    piVar7[1] = iVar18;
    if (pvVar9 != (void *)0x0) {
      memset(pvVar9,0,(long)iVar18 << 2);
    }
  }
  iVar18 = (int)uVar23;
  if (iVar18 == (int)local_50) {
    if ((int)local_50 < 0x10) {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
      }
      pVVar5->pArray = ppvVar6;
      pVVar5->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)((int)local_50 * 2) * 8;
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(__size);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar5->pArray,__size);
      }
      pVVar5->pArray = ppvVar6;
      pVVar5->nCap = (int)local_50 * 2;
    }
  }
  else {
    ppvVar6 = pVVar5->pArray;
  }
  uVar11 = iVar18 + 1;
  pVVar5->nSize = uVar11;
  ppvVar6[iVar18] = piVar7;
  if (iVar18 != vResult->nSize) {
    __assert_fail("Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x72,"Vec_Ptr_t *Llb_ManCutMap(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar19 = p->nTruePis;
  uVar17 = (ulong)iVar19;
  pvVar9 = malloc(uVar17 * 4);
  pvVar8 = malloc(uVar17 * 4);
  if (0 < (long)uVar17) {
    uVar16 = p->vCis->nSize;
    uVar13 = 0;
    uVar24 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar24 = uVar13;
    }
    do {
      if (uVar24 == uVar13) goto LAB_0083de19;
      *(undefined4 *)((long)pvVar8 + uVar13 * 4) = 0xffffffff;
      *(undefined4 *)((long)pvVar9 + uVar13 * 4) = 0xffffffff;
      uVar13 = uVar13 + 1;
    } while (uVar17 != uVar13);
  }
  iVar22 = vSupps->nSize;
  if (0 < (long)iVar22) {
    ppvVar6 = vSupps->pArray;
    lVar14 = 0;
    do {
      lVar12 = (long)*(int *)((long)ppvVar6[lVar14] + 4);
      if (0 < lVar12) {
        lVar4 = *(long *)((long)ppvVar6[lVar14] + 8);
        lVar20 = 0;
        do {
          piVar7 = *(int **)(lVar4 + lVar20 * 8);
          if (((piVar7[6] & 7U) == 2) && (iVar1 = *piVar7, lVar21 = (long)iVar1, iVar1 < iVar19)) {
            if (*(int *)((long)pvVar9 + lVar21 * 4) == -1) {
              *(int *)((long)pvVar9 + lVar21 * 4) = (int)lVar14;
            }
            *(int *)((long)pvVar8 + lVar21 * 4) = (int)lVar14;
          }
          lVar20 = lVar20 + 1;
        } while (lVar12 != lVar20);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != iVar22);
  }
  lVar14 = (long)p->nRegs;
  if (0 < lVar14) {
    pVVar10 = p->vCos;
    uVar16 = p->nTruePos;
    uVar17 = (ulong)uVar16;
    do {
      if (((int)uVar16 < 0) || (pVVar10->nSize <= (int)uVar17)) goto LAB_0083de19;
      piVar7 = (int *)(*(ulong *)((long)pVVar10->pArray[uVar17] + 8) & 0xfffffffffffffffe);
      if (((piVar7[6] & 7U) == 2) && (iVar22 = *piVar7, iVar22 < iVar19)) {
        *(int *)((long)pvVar8 + (long)iVar22 * 4) = iVar18;
      }
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  if (0 < iVar19) {
    pVVar10 = p->vCis;
    lVar14 = 0;
    do {
      if (pVVar10->nSize <= lVar14) goto LAB_0083de19;
      uVar16 = *(uint *)((long)pvVar9 + lVar14 * 4);
      uVar17 = (ulong)uVar16;
      if (uVar17 != 0xffffffff) {
        pvVar15 = pVVar10->pArray[lVar14];
        uVar2 = *(uint *)((long)pvVar8 + lVar14 * 4);
        if (uVar16 == uVar2) {
          if (((int)uVar16 < 0) || (iVar18 < (int)uVar16)) goto LAB_0083de19;
          iVar19 = *(int *)((long)pvVar15 + 0x24);
          if (((long)iVar19 < 0) || (*(int *)((long)pVVar5->pArray[uVar17] + 4) <= iVar19)) {
LAB_0083dddb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)((long)pVVar5->pArray[uVar17] + 8) + (long)iVar19 * 4) = 2;
        }
        else if ((int)uVar16 <= (int)uVar2) {
          iVar19 = uVar16 - 1;
          do {
            if (((int)uVar16 < 0) || (iVar18 < (int)uVar17)) goto LAB_0083de19;
            iVar22 = *(int *)((long)pvVar15 + 0x24);
            if (((long)iVar22 < 0) || (*(int *)((long)pVVar5->pArray[uVar17] + 4) <= iVar22))
            goto LAB_0083dddb;
            *(undefined4 *)(*(long *)((long)pVVar5->pArray[uVar17] + 8) + (long)iVar22 * 4) = 1;
            uVar17 = uVar17 + 1;
            iVar19 = iVar19 + 1;
          } while (iVar19 < (int)uVar2);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nTruePis);
  }
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  uVar16 = p->nRegs;
  printf("%d ",(ulong)uVar16);
  uVar17 = (ulong)uVar11;
  if (0 < iVar18) {
    ppvVar6 = pVVar5->pArray;
    uVar24 = 1;
    do {
      pvVar9 = ppvVar6[uVar24 - 1];
      pvVar8 = ppvVar6[uVar24];
      if (uVar24 == (uVar23 & 0xffffffff)) {
        pvVar15 = (void *)0x0;
      }
      else {
        if (uVar17 <= uVar24 + 1) {
LAB_0083de19:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar15 = ppvVar6[uVar24 + 1];
      }
      lVar14 = (long)p->vObjs->nSize;
      if (lVar14 < 1) {
        iVar19 = 0;
        iVar18 = 0;
      }
      else {
        lVar12 = 0;
        iVar18 = 0;
        iVar19 = 0;
        do {
          piVar7 = (int *)p->vObjs->pArray[lVar12];
          if (piVar7 == (int *)0x0) goto LAB_0083dc5f;
          if ((piVar7[6] & 7U) == 2) {
            iVar22 = *(int *)((long)pvVar9 + 4);
            if (p->nTruePis <= *piVar7) goto LAB_0083dc05;
            if (iVar22 <= lVar12) goto LAB_0083ddfa;
            if (*(int *)(*(long *)((long)pvVar9 + 8) + lVar12 * 4) == 0) {
              if (*(int *)((long)pvVar8 + 4) <= lVar12) goto LAB_0083ddfa;
              iVar19 = iVar19 + (uint)(*(int *)(*(long *)((long)pvVar8 + 8) + lVar12 * 4) == 1);
            }
            if (*(int *)((long)pvVar8 + 4) <= lVar12) goto LAB_0083ddfa;
            if (*(int *)(*(long *)((long)pvVar8 + 8) + lVar12 * 4) == 1) {
              if (pvVar15 != (void *)0x0) {
                if (*(int *)((long)pvVar15 + 4) <= lVar12) goto LAB_0083ddfa;
                if (*(int *)(*(long *)((long)pvVar15 + 8) + lVar12 * 4) != 0) goto LAB_0083dc5f;
              }
              iVar18 = iVar18 + 1;
            }
          }
          else {
            iVar22 = *(int *)((long)pvVar9 + 4);
LAB_0083dc05:
            if (iVar22 <= lVar12) goto LAB_0083ddfa;
            iVar22 = *(int *)(*(long *)((long)pvVar9 + 8) + lVar12 * 4);
            if (iVar22 == 1) {
              if (*(int *)((long)pvVar8 + 4) <= lVar12) goto LAB_0083ddfa;
              iVar18 = iVar18 + (uint)(*(int *)(*(long *)((long)pvVar8 + 8) + lVar12 * 4) == 0);
            }
            else if (iVar22 == 0) {
              if (*(int *)((long)pvVar8 + 4) <= lVar12) goto LAB_0083ddfa;
              iVar19 = iVar19 + (uint)(*(int *)(*(long *)((long)pvVar8 + 8) + lVar12 * 4) == 1);
            }
          }
LAB_0083dc5f:
          lVar12 = lVar12 + 1;
        } while (lVar14 != lVar12);
      }
      uVar16 = (uVar16 + iVar19) - iVar18;
      printf("%d=%d ",uVar24 & 0xffffffff,(ulong)uVar16);
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar17);
  }
  putchar(10);
  pVVar10 = p->vObjs;
  if (pVVar10->nSize < 1) {
    return pVVar5;
  }
  uVar23 = 0;
LAB_0083dcb8:
  piVar7 = (int *)pVVar10->pArray[uVar23];
  if ((piVar7 != (int *)0x0) &&
     ((((uint)*(undefined8 *)(piVar7 + 6) & 7) == 2 ||
      (0xfffffffd < ((uint)*(undefined8 *)(piVar7 + 6) & 7) - 7)))) {
    uVar24 = 0;
    do {
      if ((long)*(int *)((long)pVVar5->pArray[uVar24] + 4) <= (long)uVar23) goto LAB_0083ddfa;
      if (*(int *)(*(long *)((long)pVVar5->pArray[uVar24] + 8) + uVar23 * 4) != 0) {
        if (uVar11 != (uint)uVar24) {
          printf("Obj = %4d : ",uVar23 & 0xffffffff);
          if (((uint)*(undefined8 *)(piVar7 + 6) & 7) == 2) {
            __format = "lo  ";
            if (*piVar7 < p->nTruePis) {
              __format = "pi  ";
            }
LAB_0083dd6e:
            printf(__format);
          }
          else {
            __format = "and ";
            if (0xfffffffd < ((uint)*(undefined8 *)(piVar7 + 6) & 7) - 7) goto LAB_0083dd6e;
          }
          ppvVar6 = pVVar5->pArray;
          uVar24 = 0;
          goto LAB_0083dd81;
        }
        break;
      }
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  goto LAB_0083ddb7;
  while( true ) {
    printf("%d",(ulong)*(uint *)(*(long *)((long)ppvVar6[uVar24] + 8) + uVar23 * 4));
    uVar24 = uVar24 + 1;
    if (uVar17 == uVar24) break;
LAB_0083dd81:
    if ((long)*(int *)((long)ppvVar6[uVar24] + 4) <= (long)uVar23) {
LAB_0083ddfa:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  putchar(10);
  pVVar10 = p->vObjs;
LAB_0083ddb7:
  uVar23 = uVar23 + 1;
  if ((long)pVVar10->nSize <= (long)uVar23) {
    return pVVar5;
  }
  goto LAB_0083dcb8;
}

Assistant:

Vec_Ptr_t * Llb_ManCutMap( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Ptr_t * vSupps )
{
    int fShowMatrix = 1;
    Vec_Ptr_t * vMaps, * vOne;
    Vec_Int_t * vMap, * vPrev, * vNext;
    Aig_Obj_t * pObj;
    int * piFirst, * piLast;
    int i, k, CounterPlus, CounterMinus, Counter;

    vMaps = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vResult, vOne, i )
    {
        vMap = Vec_IntStart( Aig_ManObjNumMax(p) );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                Vec_IntWriteEntry( vMap, pObj->Id, 1 );
//            else
//printf( "*" );
//printf( "%d ", pObj->Id );
        }
        Vec_PtrPush( vMaps, vMap );
//printf( "\n" );
    }
    Vec_PtrPush( vMaps, Vec_IntStart( Aig_ManObjNumMax(p) ) );
    assert( Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1 );

    // collect the first and last PIs
    piFirst = ABC_ALLOC( int, Saig_ManPiNum(p) );
    piLast  = ABC_ALLOC( int, Saig_ManPiNum(p) );
    Saig_ManForEachPi( p, pObj, i )
        piFirst[i] = piLast[i] = -1;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSupps, vOne, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                continue;
            if ( piFirst[Aig_ObjCioId(pObj)] == -1 )
                 piFirst[Aig_ObjCioId(pObj)] = i;
            piLast[Aig_ObjCioId(pObj)] = i;
        }
    }
    // PIs feeding into the flops should be extended to the last frame
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Saig_ObjIsPi(p, Aig_ObjFanin0(pObj)) )
            continue;
        piLast[Aig_ObjCioId(Aig_ObjFanin0(pObj))] = Vec_PtrSize(vMaps)-1;
    }

    // set the PI map
    Saig_ManForEachPi( p, pObj, i )
    {
        if ( piFirst[i] == -1 )
            continue;
        if ( piFirst[i] == piLast[i] )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, piFirst[i] );
            Vec_IntWriteEntry( vMap, pObj->Id, 2 );
            continue;
        }

        // set support for all in between        
        for ( k = piFirst[i]; k <= piLast[i]; k++ )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, k );
            Vec_IntWriteEntry( vMap, pObj->Id, 1 );
        }
    }
    ABC_FREE( piFirst );
    ABC_FREE( piLast );


    // find all that will appear here
    Counter = Aig_ManRegNum(p);
    printf( "%d ", Counter );
    Vec_PtrForEachEntryStart( Vec_Int_t *, vMaps, vMap, i, 1 )
    {
        vPrev = (Vec_Int_t *)Vec_PtrEntry( vMaps, i-1 );
        vNext = (i == Vec_PtrSize(vMaps)-1)? NULL: (Vec_Int_t *)Vec_PtrEntry( vMaps, i+1 );

        CounterPlus = CounterMinus = 0;
        Aig_ManForEachObj( p, pObj, k )
        {
            if ( Saig_ObjIsPi(p, pObj) )
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vMap, k) == 1 && (vNext == NULL || Vec_IntEntry(vNext, k) == 0) )
                    CounterMinus++;
            }
            else
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vPrev, k) == 1 && Vec_IntEntry(vMap, k) == 0 )
                    CounterMinus++;
            }
        }
        Counter = Counter + CounterPlus - CounterMinus;
        printf( "%d=%d ", i, Counter );
    }
    printf( "\n" );

    if ( !fShowMatrix )
        return vMaps;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            if ( Vec_IntEntry(vMap, i) )
                break;
        if ( k == Vec_PtrSize(vMaps) )
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );

        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            printf( "%d", Vec_IntEntry(vMap, i) );
        printf( "\n" );
    }
    return vMaps;
}